

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_a<ncnn::BinaryOp_x86_avx512_functor::binary_op_max>
               (float *ptr,float *ptr1,float *outptr,int size,int elempack)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  float *pfVar4;
  int in_ECX;
  float *in_RDX;
  undefined1 (*in_RSI) [64];
  undefined1 (*in_RDI) [64];
  int in_R8D;
  __m128 _outp_2;
  __m128 _b_2;
  __m256 _outp_1;
  __m256 _b_1;
  __m512 _outp;
  __m512 _b;
  __m512 _a_512;
  __m256 _a_256;
  __m128 _a_128;
  int i;
  float a;
  binary_op_max op;
  undefined1 local_500 [64];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined1 local_440 [32];
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined1 local_400 [64];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_310;
  undefined8 uStack_308;
  int local_2fc;
  float local_2f8;
  undefined1 local_2f1 [5];
  int local_2ec;
  float *local_2e8;
  undefined1 (*local_2e0) [64];
  undefined1 (*local_2d0) [64];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  float *local_278;
  undefined1 (*local_270) [64];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  float *local_228;
  undefined1 (*local_220) [64];
  undefined8 local_210;
  undefined8 uStack_208;
  float *local_1f8;
  float local_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  float local_1d4;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 *local_1a0;
  undefined8 *local_198;
  undefined1 *local_190;
  undefined8 *local_188;
  undefined8 *local_180;
  undefined1 *local_178;
  undefined8 *local_170;
  undefined8 *local_168;
  undefined1 *local_160;
  undefined1 (*local_158) [64];
  float *local_150;
  undefined1 *local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  
  local_2f8 = *(float *)*in_RDI;
  local_2fc = 0;
  if (in_R8D == 4) {
    local_470 = *(undefined8 *)*in_RDI;
    uStack_468 = *(undefined8 *)(*in_RDI + 8);
  }
  else {
    local_470 = CONCAT44(local_2f8,local_2f8);
    uStack_468 = CONCAT44(local_2f8,local_2f8);
    local_1f0 = local_2f8;
    fStack_1ec = local_2f8;
    fStack_1e8 = local_2f8;
    fStack_1e4 = local_2f8;
    local_1d4 = local_2f8;
  }
  local_310 = local_470;
  uStack_308 = uStack_468;
  if (in_R8D == 8) {
    local_4a0 = *(undefined8 *)*in_RDI;
    uStack_498 = *(undefined8 *)(*in_RDI + 8);
    uStack_490 = *(undefined8 *)(*in_RDI + 0x10);
    uStack_488 = *(undefined8 *)(*in_RDI + 0x18);
  }
  else {
    local_1d0 = local_470;
    uStack_1c8 = uStack_468;
    local_4a0 = local_470;
    uStack_498 = uStack_468;
    uStack_490 = local_470;
    uStack_488 = uStack_468;
  }
  local_340 = local_4a0;
  uStack_338 = uStack_498;
  uStack_330 = uStack_490;
  uStack_328 = uStack_488;
  if (in_R8D == 0x10) {
    local_500 = *in_RDI;
  }
  else {
    local_1c0 = local_4a0;
    uStack_1b8 = uStack_498;
    uStack_1b0 = uStack_490;
    uStack_1a8 = uStack_488;
    auVar2._8_8_ = uStack_498;
    auVar2._0_8_ = local_4a0;
    auVar2._16_8_ = uStack_490;
    auVar2._24_8_ = uStack_488;
    local_500 = vinsertf64x4_avx512f
                          (ZEXT3264(CONCAT824(uStack_488,
                                              CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))))
                           ,auVar2,1);
  }
  local_380 = local_500._0_8_;
  uStack_378 = local_500._8_8_;
  uStack_370 = local_500._16_8_;
  uStack_368 = local_500._24_8_;
  uStack_360 = local_500._32_8_;
  uStack_358 = local_500._40_8_;
  uStack_350 = local_500._48_8_;
  uStack_348 = local_500._56_8_;
  local_2e8 = in_RDX;
  local_2e0 = in_RSI;
  for (; local_2fc + 0xf < in_ECX; local_2fc = local_2fc + 0x10) {
    local_2d0 = local_2e0;
    local_3c0 = *(undefined8 *)*local_2e0;
    uStack_3b8 = *(undefined8 *)(*local_2e0 + 8);
    uStack_3b0 = *(undefined8 *)(*local_2e0 + 0x10);
    uStack_3a8 = *(undefined8 *)(*local_2e0 + 0x18);
    uStack_3a0 = *(undefined8 *)(*local_2e0 + 0x20);
    uStack_398 = *(undefined8 *)(*local_2e0 + 0x28);
    uStack_390 = *(undefined8 *)(*local_2e0 + 0x30);
    uStack_388 = *(undefined8 *)(*local_2e0 + 0x38);
    local_190 = local_2f1;
    local_198 = &local_380;
    local_1a0 = &local_3c0;
    local_100 = local_500._0_8_;
    uStack_f8 = local_500._8_8_;
    uStack_f0 = local_500._16_8_;
    uStack_e8 = local_500._24_8_;
    uStack_e0 = local_500._32_8_;
    uStack_d8 = local_500._40_8_;
    uStack_d0 = local_500._48_8_;
    uStack_c8 = local_500._56_8_;
    local_400 = vmaxps_avx512f(local_500,*local_2e0);
    local_278 = local_2e8;
    local_2c0 = local_400._0_8_;
    uStack_2b8 = local_400._8_8_;
    uStack_2b0 = local_400._16_8_;
    uStack_2a8 = local_400._24_8_;
    uStack_2a0 = local_400._32_8_;
    uStack_298 = local_400._40_8_;
    uStack_290 = local_400._48_8_;
    uStack_288 = local_400._56_8_;
    *(undefined8 *)local_2e8 = local_400._0_8_;
    *(undefined8 *)(local_2e8 + 2) = local_400._8_8_;
    *(undefined8 *)(local_2e8 + 4) = local_400._16_8_;
    *(undefined8 *)(local_2e8 + 6) = local_400._24_8_;
    *(undefined8 *)(local_2e8 + 8) = local_400._32_8_;
    *(undefined8 *)(local_2e8 + 10) = local_400._40_8_;
    *(undefined8 *)(local_2e8 + 0xc) = local_400._48_8_;
    *(undefined8 *)(local_2e8 + 0xe) = local_400._56_8_;
    local_2e0 = local_2e0 + 1;
    local_2e8 = local_2e8 + 0x10;
    local_140 = local_3c0;
    uStack_138 = uStack_3b8;
    uStack_130 = uStack_3b0;
    uStack_128 = uStack_3a8;
    uStack_120 = uStack_3a0;
    uStack_118 = uStack_398;
    uStack_110 = uStack_390;
    uStack_108 = uStack_388;
  }
  for (; local_2fc + 7 < in_ECX; local_2fc = local_2fc + 8) {
    local_270 = local_2e0;
    local_420 = *(undefined8 *)*local_2e0;
    uStack_418 = *(undefined8 *)(*local_2e0 + 8);
    uStack_410 = *(undefined8 *)(*local_2e0 + 0x10);
    uStack_408 = *(undefined8 *)(*local_2e0 + 0x18);
    local_178 = local_2f1;
    local_180 = &local_340;
    local_188 = &local_420;
    local_a0 = local_4a0;
    uStack_98 = uStack_498;
    uStack_90 = uStack_490;
    uStack_88 = uStack_488;
    auVar3._8_8_ = uStack_498;
    auVar3._0_8_ = local_4a0;
    auVar3._16_8_ = uStack_490;
    auVar3._24_8_ = uStack_488;
    local_440 = vmaxps_avx(auVar3,*(undefined1 (*) [32])*local_2e0);
    local_228 = local_2e8;
    local_260 = local_440._0_8_;
    uStack_258 = local_440._8_8_;
    uStack_250 = local_440._16_8_;
    uStack_248 = local_440._24_8_;
    *(undefined8 *)local_2e8 = local_440._0_8_;
    *(undefined8 *)(local_2e8 + 2) = local_440._8_8_;
    *(undefined8 *)(local_2e8 + 4) = local_440._16_8_;
    *(undefined8 *)(local_2e8 + 6) = local_440._24_8_;
    local_2e0 = (undefined1 (*) [64])(*local_2e0 + 0x20);
    local_2e8 = local_2e8 + 8;
    local_c0 = local_420;
    uStack_b8 = uStack_418;
    uStack_b0 = uStack_410;
    uStack_a8 = uStack_408;
  }
  for (; local_2ec = in_ECX, local_2fc + 3 < in_ECX; local_2fc = local_2fc + 4) {
    local_220 = local_2e0;
    local_450 = *(undefined8 *)*local_2e0;
    uStack_448 = *(undefined8 *)(*local_2e0 + 8);
    local_160 = local_2f1;
    local_168 = &local_310;
    local_170 = &local_450;
    local_60 = local_470;
    uStack_58 = uStack_468;
    auVar1._8_8_ = uStack_468;
    auVar1._0_8_ = local_470;
    auVar1 = vmaxps_avx(auVar1,*(undefined1 (*) [16])*local_2e0);
    local_1f8 = local_2e8;
    local_460 = auVar1._0_8_;
    local_210 = local_460;
    uStack_458 = auVar1._8_8_;
    uStack_208 = uStack_458;
    *(undefined8 *)local_2e8 = local_460;
    *(undefined8 *)(local_2e8 + 2) = uStack_458;
    local_2e0 = (undefined1 (*) [64])(*local_2e0 + 0x10);
    local_2e8 = local_2e8 + 4;
    local_70 = local_450;
    uStack_68 = uStack_448;
  }
  for (; local_2fc < local_2ec; local_2fc = local_2fc + 1) {
    local_148 = local_2f1;
    local_150 = &local_2f8;
    local_158 = local_2e0;
    pfVar4 = std::max<float>(local_150,(float *)local_2e0);
    *local_2e8 = *pfVar4;
    local_2e0 = (undefined1 (*) [64])(*local_2e0 + 4);
    local_2e8 = local_2e8 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_a(const float* ptr, const float* ptr1, float* outptr, int size, int elempack)
{
    const Op op;

    const float a = *ptr;

    int i = 0;
#if __SSE2__
    __m128 _a_128 = (elempack == 4) ? _mm_loadu_ps(ptr) : _mm_set1_ps(a);
#if __AVX__
    __m256 _a_256 = (elempack == 8) ? _mm256_loadu_ps(ptr) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a_128), _a_128, 1);
#if __AVX512F__
    __m512 _a_512 = (elempack == 16) ? _mm512_loadu_ps(ptr) : _mm512_insertf32x8(_mm512_castps256_ps512(_a_256), _a_256, 1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_a_512, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_a_256, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_a_128, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(a, *ptr1);
        ptr1 += 1;
        outptr += 1;
    }
}